

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

void __thiscall
phmap::priv::(anonymous_namespace)::
ExpectOperationCounts<phmap::priv::(anonymous_namespace)::SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,61,std::less<phmap::test_internal::MovableOnlyInstance>>>
          (_anonymous_namespace_ *this,int expected_moves,int expected_comparisons,
          vector<int,_std::allocator<int>_> *values,InstanceTracker *tracker,
          SizedBtreeSet<phmap::test_internal::MovableOnlyInstance,_61,_std::less<phmap::test_internal::MovableOnlyInstance>_>
          *set)

{
  long lVar1;
  undefined4 in_register_00000014;
  vector<int,_std::allocator<int>_> *pvVar2;
  char *pcVar3;
  AssertHelper local_68;
  key_type local_60;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  int local_38;
  int local_34;
  
  pvVar2 = (vector<int,_std::allocator<int>_> *)CONCAT44(in_register_00000014,expected_comparisons);
  local_34 = (int)this;
  lVar1 = test_internal::BaseCountedInstance::num_instances_;
  local_38 = expected_moves;
  if (pvVar2 != values) {
    test_internal::BaseCountedInstance::num_instances_ =
         test_internal::BaseCountedInstance::num_instances_ + 1;
    do {
      local_60.super_BaseCountedInstance.value_ =
           (size_t)*(int *)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
      local_60.super_BaseCountedInstance.is_live_ = true;
      test_internal::BaseCountedInstance::num_live_instances_ =
           test_internal::BaseCountedInstance::num_live_instances_ + 1;
      btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
      ::insert_unique<phmap::test_internal::MovableOnlyInstance>
                ((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>,_phmap::test_internal::MovableOnlyInstance_&,_phmap::test_internal::MovableOnlyInstance_*>,_bool>
                  *)local_50,
                 (btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                  *)set,&local_60,&local_60);
      if (local_60.super_BaseCountedInstance.is_live_ == true) {
        test_internal::BaseCountedInstance::num_live_instances_ =
             test_internal::BaseCountedInstance::num_live_instances_ + -1;
      }
      pvVar2 = (vector<int,_std::allocator<int>_> *)
               ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 4);
      lVar1 = test_internal::BaseCountedInstance::num_instances_ + -1;
    } while (pvVar2 != values);
  }
  test_internal::BaseCountedInstance::num_instances_ = lVar1;
  if ((set->
      super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
      ).
      super_btree_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
      .tree_.size_ != 0) {
    btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
    ::internal_clear((btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>
                      *)set,(node_type *)
                            (set->
                            super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
                            ).
                            super_btree_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
                    );
  }
  (set->
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
  ).
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
       = (_Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_*>
          )btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
           ::EmptyNode()::empty_node;
  (set->
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
  ).
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
  .tree_.rightmost_ =
       (node_type *)
       btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,std::allocator<phmap::test_internal::MovableOnlyInstance>,992,false>>
       ::EmptyNode()::empty_node;
  (set->
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
  ).
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_std::allocator<phmap::test_internal::MovableOnlyInstance>,_992,_false>_>_>
  .tree_.size_ = 0;
  local_60.super_BaseCountedInstance.value_ =
       test_internal::BaseCountedInstance::num_moves_ - tracker->start_moves_;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_50,"tracker->moves()","expected_moves",(unsigned_long *)&local_60,
             &local_34);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x565,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60.super_BaseCountedInstance.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.super_BaseCountedInstance.value_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_60.super_BaseCountedInstance.value_ =
       test_internal::BaseCountedInstance::num_comparisons_ - tracker->start_comparisons_;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_50,"tracker->comparisons()","expected_comparisons",
             (unsigned_long *)&local_60,&local_38);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x566,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60.super_BaseCountedInstance.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.super_BaseCountedInstance.value_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_60.super_BaseCountedInstance.value_ =
       test_internal::BaseCountedInstance::num_copies_ - tracker->start_copies_;
  local_68.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_50,"tracker->copies()","0",(unsigned_long *)&local_60,
             (int *)&local_68);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x567,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60.super_BaseCountedInstance.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.super_BaseCountedInstance.value_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_60.super_BaseCountedInstance.value_ =
       test_internal::BaseCountedInstance::num_swaps_ - tracker->start_swaps_;
  local_68.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_50,"tracker->swaps()","0",(unsigned_long *)&local_60,(int *)&local_68
            );
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x568,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)local_60.super_BaseCountedInstance.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_60.super_BaseCountedInstance.value_ + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  tracker->start_moves_ = test_internal::BaseCountedInstance::num_moves_;
  tracker->start_copies_ = test_internal::BaseCountedInstance::num_copies_;
  tracker->start_swaps_ = test_internal::BaseCountedInstance::num_swaps_;
  tracker->start_comparisons_ = test_internal::BaseCountedInstance::num_comparisons_;
  return;
}

Assistant:

void ExpectOperationCounts(const int expected_moves,
                               const int expected_comparisons,
                               const std::vector<int> &values,
                               InstanceTracker *tracker, Set *set) {
        for (const int v : values) set->insert(MovableOnlyInstance(v));
        set->clear();
        EXPECT_EQ(tracker->moves(), expected_moves);
        EXPECT_EQ(tracker->comparisons(), expected_comparisons);
        EXPECT_EQ(tracker->copies(), 0);
        EXPECT_EQ(tracker->swaps(), 0);
        tracker->ResetCopiesMovesSwaps();
    }